

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::MultiVertexArrayStrideTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayStrideTests *this,Spec *spec)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  InputType type;
  string local_1d8;
  int local_1b8;
  int arrayNdx;
  stringstream local_1a8 [8];
  stringstream name;
  ostream local_198;
  Spec *local_20;
  Spec *spec_local;
  MultiVertexArrayStrideTests *this_local;
  
  local_20 = spec;
  spec_local = (Spec *)this;
  this_local = (MultiVertexArrayStrideTests *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar2 = std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::size(&local_20->arrays);
  std::ostream::operator<<(&local_198,sVar2);
  local_1b8 = 0;
  while( true ) {
    iVar1 = local_1b8;
    sVar2 = std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::size(&local_20->arrays);
    if ((int)sVar2 <= iVar1) break;
    poVar3 = std::operator<<(&local_198,"_");
    pvVar4 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&local_20->arrays,(long)local_1b8);
    deqp::gls::Array::inputTypeToString_abi_cxx11_
              (&local_1d8,(Array *)(ulong)pvVar4->inputType,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    pvVar4 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&local_20->arrays,(long)local_1b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->componentCount);
    poVar3 = std::operator<<(poVar3,"_");
    pvVar4 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&local_20->arrays,(long)local_1b8);
    std::ostream::operator<<(poVar3,pvVar4->stride);
    std::__cxx11::string::~string((string *)&local_1d8);
    local_1b8 = local_1b8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayStrideTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;

	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::inputTypeToString(spec.arrays[arrayNdx].inputType)
			<< spec.arrays[arrayNdx].componentCount << "_"
			<< spec.arrays[arrayNdx].stride;
	}

	return name.str();
}